

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::MergeFrom(ExtensionSet *this,ExtensionSet *other)

{
  bool bVar1;
  KeyValue *it_ys;
  KeyValue *end_xs;
  ExtensionSet *in_RSI;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  in_RDI;
  size_t in_stack_00000078;
  ExtensionSet *in_stack_00000080;
  map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
  *in_stack_ffffffffffffff98;
  KeyValue *in_stack_ffffffffffffffa8;
  KeyValue *in_stack_ffffffffffffffb8;
  KeyValue *in_stack_ffffffffffffffc0;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  in_stack_ffffffffffffffd0;
  
  bVar1 = is_large((ExtensionSet *)in_RDI._M_node);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = is_large(in_RSI);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      flat_begin((ExtensionSet *)in_RDI._M_node);
      flat_end((ExtensionSet *)in_RDI._M_node);
      std::
      map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
      ::begin(in_stack_ffffffffffffff98);
      std::
      map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
      ::end(in_stack_ffffffffffffff98);
      (anonymous_namespace)::
      SizeOfUnion<google::protobuf::internal::ExtensionSet::KeyValue*,std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffd0,
                 in_RDI);
      GrowCapacity(in_stack_00000080,in_stack_00000078);
    }
    else {
      it_ys = flat_begin((ExtensionSet *)in_RDI._M_node);
      end_xs = flat_end((ExtensionSet *)in_RDI._M_node);
      in_stack_ffffffffffffffc0 = flat_begin(in_RSI);
      flat_end(in_RSI);
      (anonymous_namespace)::
      SizeOfUnion<google::protobuf::internal::ExtensionSet::KeyValue*,google::protobuf::internal::ExtensionSet::KeyValue_const*>
                (in_stack_ffffffffffffffc0,end_xs,it_ys,in_stack_ffffffffffffffa8);
      GrowCapacity(in_stack_00000080,in_stack_00000078);
    }
  }
  ForEach<google::protobuf::internal::ExtensionSet::MergeFrom(google::protobuf::internal::ExtensionSet_const&)::__0>
            ((ExtensionSet *)in_stack_ffffffffffffffc0,(anon_class_8_1_8991fb9c)in_RDI._M_node);
  return;
}

Assistant:

void ExtensionSet::MergeFrom(const ExtensionSet& other) {
  if (PROTOBUF_PREDICT_TRUE(!is_large())) {
    if (PROTOBUF_PREDICT_TRUE(!other.is_large())) {
      GrowCapacity(SizeOfUnion(flat_begin(), flat_end(), other.flat_begin(),
                               other.flat_end()));
    } else {
      GrowCapacity(SizeOfUnion(flat_begin(), flat_end(),
                               other.map_.large->begin(),
                               other.map_.large->end()));
    }
  }
  other.ForEach([this](int number, const Extension& ext) {
    this->InternalExtensionMergeFrom(number, ext);
  });
}